

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool ON_IsUnsignedChunkTypecode(ON__UINT32 typecode)

{
  if ((int)typecode < 0) {
    if ((int)typecode < -0x7dffff8f) {
      if ((typecode != 0x80400001) && (typecode != 0x80400006)) {
        return false;
      }
    }
    else if ((typecode != 0x82000071) && (typecode != 0xa0000026)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ON_IsUnsignedChunkTypecode( ON__UINT32 typecode )
{
  // returns tru if the chunk value should be treated as an unsigned int.
  return ( 0 == (TCODE_SHORT & typecode)
           || TCODE_RGB == typecode 
           || TCODE_RGBDISPLAY == typecode
           || TCODE_PROPERTIES_OPENNURBS_VERSION == typecode
           || TCODE_OBJECT_RECORD_TYPE == typecode
         );
}